

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

int __thiscall crnlib::etc1_optimizer::init(etc1_optimizer *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  uint min_new_capacity;
  color_quad_u8 cVar2;
  color_quad_u8 *pcVar3;
  uint *puVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  undefined1 auVar9 [13];
  uint i_1;
  uint uVar10;
  ulong uVar11;
  uint *puVar12;
  results *in_RDX;
  long lVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar19;
  undefined1 auVar18 [16];
  vec3F avg_color;
  undefined8 local_40;
  float local_38;
  undefined8 local_30;
  float local_28;
  
  this->m_pParams = (params *)ctx;
  this->m_pResult = in_RDX;
  min_new_capacity = *(uint *)(ctx + 8);
  uVar10 = (this->m_selectors).m_size;
  if (uVar10 != min_new_capacity) {
    if (uVar10 <= min_new_capacity) {
      if ((this->m_selectors).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_selectors,min_new_capacity,
                   uVar10 + 1 == min_new_capacity,1,(object_mover)0x0,false);
      }
      uVar10 = (this->m_selectors).m_size;
      memset((this->m_selectors).m_p + uVar10,0,(ulong)(min_new_capacity - uVar10));
    }
    (this->m_selectors).m_size = min_new_capacity;
  }
  uVar10 = (this->m_best_selectors).m_size;
  if (uVar10 != min_new_capacity) {
    if (uVar10 <= min_new_capacity) {
      if ((this->m_best_selectors).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_best_selectors,min_new_capacity,
                   uVar10 + 1 == min_new_capacity,1,(object_mover)0x0,false);
      }
      uVar10 = (this->m_best_selectors).m_size;
      memset((this->m_best_selectors).m_p + uVar10,0,(ulong)(min_new_capacity - uVar10));
    }
    (this->m_best_selectors).m_size = min_new_capacity;
  }
  uVar10 = (this->m_temp_selectors).m_size;
  if (uVar10 != min_new_capacity) {
    if (uVar10 <= min_new_capacity) {
      if ((this->m_temp_selectors).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_temp_selectors,min_new_capacity,
                   uVar10 + 1 == min_new_capacity,1,(object_mover)0x0,false);
      }
      uVar10 = (this->m_temp_selectors).m_size;
      memset((this->m_temp_selectors).m_p + uVar10,0,(ulong)(min_new_capacity - uVar10));
    }
    (this->m_temp_selectors).m_size = min_new_capacity;
  }
  uVar10 = (this->m_trial_solution).m_selectors.m_size;
  if (uVar10 != min_new_capacity) {
    if (uVar10 <= min_new_capacity) {
      if ((this->m_trial_solution).m_selectors.m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&(this->m_trial_solution).m_selectors,min_new_capacity,
                   uVar10 + 1 == min_new_capacity,1,(object_mover)0x0,false);
      }
      uVar10 = (this->m_trial_solution).m_selectors.m_size;
      memset((this->m_trial_solution).m_selectors.m_p + uVar10,0,(ulong)(min_new_capacity - uVar10))
      ;
    }
    (this->m_trial_solution).m_selectors.m_size = min_new_capacity;
  }
  uVar10 = (this->m_best_solution).m_selectors.m_size;
  if (uVar10 != min_new_capacity) {
    if (uVar10 <= min_new_capacity) {
      if ((this->m_best_solution).m_selectors.m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&(this->m_best_solution).m_selectors,min_new_capacity,
                   uVar10 + 1 == min_new_capacity,1,(object_mover)0x0,false);
      }
      uVar10 = (this->m_best_solution).m_selectors.m_size;
      memset((this->m_best_solution).m_selectors.m_p + uVar10,0,(ulong)(min_new_capacity - uVar10));
    }
    (this->m_best_solution).m_selectors.m_size = min_new_capacity;
  }
  this->m_limit = (this->m_pParams->m_use_color4 ^ 1) << 4 | 0xf;
  local_38 = 0.0;
  local_40 = 0;
  uVar10 = (this->m_luma).m_size;
  if (uVar10 != min_new_capacity) {
    if (uVar10 <= min_new_capacity) {
      if ((this->m_luma).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_luma,min_new_capacity,uVar10 + 1 == min_new_capacity
                   ,2,(object_mover)0x0,false);
      }
      uVar10 = (this->m_luma).m_size;
      memset((this->m_luma).m_p + uVar10,0,(ulong)(min_new_capacity - uVar10) * 2);
    }
    (this->m_luma).m_size = min_new_capacity;
  }
  uVar10 = this->m_sorted_luma[0].m_size;
  if (uVar10 != min_new_capacity) {
    if (uVar10 <= min_new_capacity) {
      if (this->m_sorted_luma[0].m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this->m_sorted_luma,min_new_capacity,
                   uVar10 + 1 == min_new_capacity,4,(object_mover)0x0,false);
      }
      uVar10 = this->m_sorted_luma[0].m_size;
      memset(this->m_sorted_luma[0].m_p + uVar10,0,(ulong)(min_new_capacity - uVar10) << 2);
    }
    this->m_sorted_luma[0].m_size = min_new_capacity;
  }
  uVar10 = this->m_sorted_luma[1].m_size;
  if (uVar10 != min_new_capacity) {
    if (uVar10 <= min_new_capacity) {
      if (this->m_sorted_luma[1].m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)(this->m_sorted_luma + 1),min_new_capacity,
                   uVar10 + 1 == min_new_capacity,4,(object_mover)0x0,false);
      }
      uVar10 = this->m_sorted_luma[1].m_size;
      memset(this->m_sorted_luma[1].m_p + uVar10,0,(ulong)(min_new_capacity - uVar10) << 2);
    }
    this->m_sorted_luma[1].m_size = min_new_capacity;
  }
  if (min_new_capacity != 0) {
    uVar11 = 0;
    do {
      pcVar3 = this->m_pParams->m_pSrc_pixels;
      cVar2.field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
            &pcVar3[uVar11].field_0.field_0;
      uVar8 = (ulong)cVar2.field_0._0_2_ & 0xffffffffffff00ff;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar8;
      auVar5[0xc] = cVar2.field_0._3_1_;
      auVar6[8] = cVar2.field_0._2_1_;
      auVar6._0_8_ = uVar8;
      auVar6[9] = 0;
      auVar6._10_3_ = auVar5._10_3_;
      auVar9._5_8_ = 0;
      auVar9._0_5_ = auVar6._8_5_;
      auVar7[4] = cVar2.field_0._1_1_;
      auVar7._0_4_ = (int)uVar8;
      auVar7[5] = 0;
      auVar7._6_7_ = SUB137(auVar9 << 0x40,6);
      local_30 = CONCAT44((float)auVar7._4_4_,(float)(int)uVar8);
      local_28 = (float)pcVar3[uVar11].field_0.field_0.b;
      lVar13 = 0;
      do {
        *(float *)((long)&local_40 + lVar13 * 4) =
             *(float *)((long)&local_30 + lVar13 * 4) + *(float *)((long)&local_40 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      (this->m_luma).m_p[uVar11] =
           (ushort)pcVar3[uVar11].field_0.field_0.b +
           (ushort)pcVar3[uVar11].field_0.field_0.g + (ushort)pcVar3[uVar11].field_0.field_0.r;
      this->m_sorted_luma[0].m_p[uVar11] = (uint)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar11 != min_new_capacity);
  }
  lVar13 = 0;
  do {
    *(float *)((long)&local_40 + lVar13 * 4) =
         *(float *)((long)&local_40 + lVar13 * 4) / (float)min_new_capacity;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  *(undefined8 *)(this->m_avg_color).m_s = local_40;
  (this->m_avg_color).m_s[2] = local_38;
  uVar10 = this->m_limit;
  fVar14 = (float)(int)uVar10;
  uVar1 = *(undefined8 *)(this->m_avg_color).m_s;
  auVar18._0_4_ = fVar14 * (float)uVar1;
  auVar18._4_4_ = fVar14 * (float)((ulong)uVar1 >> 0x20);
  auVar18._8_4_ = fVar14 * 0.0;
  auVar18._12_4_ = fVar14 * 0.0;
  auVar18 = divps(auVar18,_DAT_001ba770);
  fVar17 = auVar18._0_4_ + 0.5;
  fVar19 = auVar18._4_4_ + 0.5;
  uVar15 = (uint)fVar17;
  uVar16 = (uint)fVar19;
  uVar15 = (int)(fVar17 - 2.1474836e+09) & (int)uVar15 >> 0x1f | uVar15;
  uVar16 = (int)(fVar19 - 2.1474836e+09) & (int)uVar16 >> 0x1f | uVar16;
  this->m_br = ~-(uint)((int)uVar15 < 0) &
               (~-(uint)((int)uVar15 < (int)uVar10) & uVar10 |
               uVar15 & -(uint)((int)uVar15 < (int)uVar10));
  this->m_bg = ~-(uint)((int)uVar16 < 0) &
               (~-(uint)((int)uVar16 < (int)uVar10) & uVar10 |
               uVar16 & -(uint)((int)uVar16 < (int)uVar10));
  uVar15 = (uint)(long)((fVar14 * (this->m_avg_color).m_s[2]) / 255.0 + 0.5);
  if ((int)uVar15 < (int)uVar10) {
    uVar10 = uVar15;
  }
  uVar16 = 0;
  if (-1 < (int)uVar15) {
    uVar16 = uVar10;
  }
  this->m_bb = uVar16;
  if ((this->m_pParams->super_crn_etc1_pack_params).m_quality < cCRNETCQualitySlow) {
    puVar12 = indirect_radix_sort<unsigned_int,unsigned_short>
                        (min_new_capacity,this->m_sorted_luma[0].m_p,this->m_sorted_luma[1].m_p,
                         (this->m_luma).m_p,0,2,false);
    this->m_pSorted_luma_indices = puVar12;
    puVar4 = this->m_sorted_luma[0].m_p;
    this->m_pSorted_luma = puVar4;
    if (puVar12 == puVar4) {
      this->m_pSorted_luma = this->m_sorted_luma[1].m_p;
    }
    if (min_new_capacity != 0) {
      uVar11 = 0;
      do {
        this->m_pSorted_luma[uVar11] =
             (uint)(this->m_luma).m_p[this->m_pSorted_luma_indices[uVar11]];
        uVar11 = uVar11 + 1;
      } while (min_new_capacity != uVar11);
    }
  }
  (this->m_best_solution).m_coords.m_color4 = false;
  (this->m_best_solution).m_coords.m_unscaled_color =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  (this->m_best_solution).m_coords.m_inten_table = 0;
  (this->m_best_solution).m_valid = false;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  return 0;
}

Assistant:

void etc1_optimizer::init(const params& params, results& result) {
  m_pParams = &params;
  m_pResult = &result;

  const uint n = m_pParams->m_num_src_pixels;

  m_selectors.resize(n);
  m_best_selectors.resize(n);
  m_temp_selectors.resize(n);
  m_trial_solution.m_selectors.resize(n);
  m_best_solution.m_selectors.resize(n);

  m_limit = m_pParams->m_use_color4 ? 15 : 31;

  vec3F avg_color(0.0f);

  m_luma.resize(n);
  m_sorted_luma[0].resize(n);
  m_sorted_luma[1].resize(n);

  for (uint i = 0; i < n; i++) {
    const color_quad_u8& c = m_pParams->m_pSrc_pixels[i];
    const vec3F fc(c.r, c.g, c.b);

    avg_color += fc;

    m_luma[i] = static_cast<uint16>(c.r + c.g + c.b);
    m_sorted_luma[0][i] = i;
  }
  avg_color /= static_cast<float>(n);
  m_avg_color = avg_color;

  m_br = math::clamp<int>(static_cast<uint>(m_avg_color[0] * m_limit / 255.0f + .5f), 0, m_limit);
  m_bg = math::clamp<int>(static_cast<uint>(m_avg_color[1] * m_limit / 255.0f + .5f), 0, m_limit);
  m_bb = math::clamp<int>(static_cast<uint>(m_avg_color[2] * m_limit / 255.0f + .5f), 0, m_limit);

  if (m_pParams->m_quality <= cCRNETCQualityMedium) {
    m_pSorted_luma_indices = indirect_radix_sort(n, m_sorted_luma[0].get_ptr(), m_sorted_luma[1].get_ptr(), m_luma.get_ptr(), 0, sizeof(m_luma[0]), false);
    m_pSorted_luma = m_sorted_luma[0].get_ptr();
    if (m_pSorted_luma_indices == m_sorted_luma[0].get_ptr())
      m_pSorted_luma = m_sorted_luma[1].get_ptr();

    for (uint i = 0; i < n; i++)
      m_pSorted_luma[i] = m_luma[m_pSorted_luma_indices[i]];
  }

  m_best_solution.m_coords.clear();
  m_best_solution.m_valid = false;
  m_best_solution.m_error = cUINT64_MAX;
}